

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  string format;
  allocator<char> local_101;
  string local_100;
  FilePath local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  pcVar2 = FLAGS_gtest_output_abi_cxx11_;
  GetOutputFormat_abi_cxx11_();
  if (local_38 == 0) {
    paVar1 = &local_e0.pathname_.field_2;
    local_e0.pathname_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"xml","");
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0.pathname_._M_dataplus._M_p,
                      local_e0.pathname_.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = strchr(pcVar2,0x3a);
  if (pcVar2 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_60);
    FilePath::FilePath((FilePath *)&local_100,&local_a0);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"test_detail","");
    FilePath::FilePath((FilePath *)&local_c0,&local_80);
    FilePath::MakeFileName
              (&local_e0,(FilePath *)&local_100,(FilePath *)&local_c0,0,(char *)local_40);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.pathname_._M_dataplus._M_p != &local_e0.pathname_.field_2) {
      operator_delete(local_e0.pathname_._M_dataplus._M_p,
                      local_e0.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00118ada;
  }
  else {
    __s = pcVar2 + 1;
    paVar1 = &local_100.field_2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,__s,pcVar2 + sVar3 + 1);
    FilePath::FilePath(&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (*local_e0.pathname_._M_dataplus._M_p != '/') {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_101);
      FilePath::FilePath((FilePath *)&local_a0,&local_c0);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar3);
      FilePath::FilePath((FilePath *)&local_80,&local_60);
      FilePath::ConcatPaths((FilePath *)&local_100,(FilePath *)&local_a0,(FilePath *)&local_80);
      std::__cxx11::string::_M_assign((string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_e0.pathname_._M_string_length == 0) ||
       (local_e0.pathname_._M_dataplus._M_p[local_e0.pathname_._M_string_length - 1] != '/')) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)&local_100,&local_e0,(FilePath *)&local_a0,local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    local_a0.field_2._M_allocated_capacity = local_e0.pathname_.field_2._M_allocated_capacity;
    local_a0._M_dataplus._M_p = local_e0.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.pathname_._M_dataplus._M_p == &local_e0.pathname_.field_2) goto LAB_00118ada;
  }
  operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
LAB_00118ada:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}